

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

bool __thiscall
IRT::JumpPattern::TryToGenerateCode
          (JumpPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CJumpStatement *this_00;
  CLabelStatement *this_01;
  bool bVar1;
  undefined1 local_60 [16];
  string local_50;
  CLabel local_30;
  
  if (tree == (INode *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = false;
    this_00 = (CJumpStatement *)__dynamic_cast(tree,&INode::typeinfo,&CJumpStatement::typeinfo,0);
    if (this_00 != (CJumpStatement *)0x0) {
      this_01 = CJumpStatement::getLabel(this_00);
      CLabelStatement::Label(&local_30,this_01);
      CLabel::ToString_abi_cxx11_((string *)(local_60 + 0x10),&local_30);
      std::make_shared<AssemblyCode::JumpCommand,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::JumpCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::JumpCommand> *)local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      std::__cxx11::string::~string((string *)(local_60 + 0x10));
      std::__cxx11::string::~string((string *)&local_30);
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool IRT::JumpPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                          AssemblyCommands &commands ) {
    ConstJumpPtr jumpPtr = dynamic_cast<ConstJumpPtr>(tree);
    if ( jumpPtr ) {
        commands.emplace_back(
                std::make_shared<AssemblyCode::JumpCommand>( jumpPtr->getLabel( )->Label( ).ToString( )));
        return true;
    }
    return false;
}